

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

bool ImTui_ImplText_Init(void)

{
  ImGuiStyle *pIVar1;
  int tex_h;
  int tex_w;
  uchar *tex_pixels;
  ImFontConfig fontConfig;
  ImFontConfig *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  uchar **in_stack_ffffffffffffff08;
  ImFontAtlas *in_stack_ffffffffffffff10;
  ImVec4 local_a0;
  float local_90;
  float fStack_8c;
  ImFontConfig *in_stack_ffffffffffffff78;
  ImFontAtlas *in_stack_ffffffffffffff80;
  float local_78;
  float fStack_74;
  ImVec4 local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  pIVar1 = ImGui::GetStyle();
  pIVar1->Alpha = 1.0;
  ImVec2::ImVec2(&local_8,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowPadding = local_8;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowBorderSize = 0.0;
  ImVec2::ImVec2(&local_10,4.0,2.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowMinSize = local_10;
  ImVec2::ImVec2(&local_18,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowTitleAlign = local_18;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowMenuButtonPosition = 0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupBorderSize = 0.0;
  ImVec2::ImVec2(&local_20,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->FramePadding = local_20;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameBorderSize = 0.0;
  ImVec2::ImVec2(&local_28,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ItemSpacing = local_28;
  ImVec2::ImVec2(&local_30,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ItemInnerSpacing = local_30;
  ImVec2::ImVec2(&local_38,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->TouchExtraPadding = local_38;
  pIVar1 = ImGui::GetStyle();
  pIVar1->IndentSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColumnsMinSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarSize = 0.5;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabMinSize = 0.1;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColorButtonPosition = 1;
  ImVec2::ImVec2(&local_40,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ButtonTextAlign = local_40;
  ImVec2::ImVec2(&local_48,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->SelectableTextAlign = local_48;
  ImVec2::ImVec2(&local_50,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->DisplayWindowPadding = local_50;
  ImVec2::ImVec2(&local_58,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->DisplaySafeAreaPadding = local_58;
  ImVec2::ImVec2(&local_60,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->CellPadding = local_60;
  pIVar1 = ImGui::GetStyle();
  pIVar1->MouseCursorScale = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedLines = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedFill = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->CurveTessellationTol = 1.25;
  ImVec4::ImVec4(&local_70,0.15,0.15,0.15,1.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[2].x = local_70.x;
  pIVar1->Colors[2].y = local_70.y;
  pIVar1->Colors[2].z = local_70.z;
  pIVar1->Colors[2].w = local_70.w;
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff80,0.35,0.35,0.35,1.0);
  pIVar1 = ImGui::GetStyle();
  *(ImFontAtlas **)(pIVar1->Colors + 10) = in_stack_ffffffffffffff80;
  pIVar1->Colors[10].z = local_78;
  pIVar1->Colors[10].w = fStack_74;
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff70,0.15,0.15,0.15,1.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0xc].x = local_90;
  pIVar1->Colors[0xc].y = fStack_8c;
  *(ImFontConfig **)&pIVar1->Colors[0xc].z = in_stack_ffffffffffffff78;
  ImVec4::ImVec4(&local_a0,0.75,0.75,0.75,0.5);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0x2f].x = local_a0.x;
  pIVar1->Colors[0x2f].y = local_a0.y;
  pIVar1->Colors[0x2f].z = local_a0.z;
  pIVar1->Colors[0x2f].w = local_a0.w;
  ImFontConfig::ImFontConfig(in_stack_fffffffffffffed0);
  ImGui::GetIO();
  ImFontAtlas::AddFontDefault(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  return true;
}

Assistant:

bool ImTui_ImplText_Init() {
    ImGui::GetStyle().Alpha                   = 1.0f;
    ImGui::GetStyle().WindowPadding           = ImVec2(0.5,0.0);
    ImGui::GetStyle().WindowRounding          = 0.0f;
    ImGui::GetStyle().WindowBorderSize        = 0.0f;
    ImGui::GetStyle().WindowMinSize           = ImVec2(4,2);
    ImGui::GetStyle().WindowTitleAlign        = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().WindowMenuButtonPosition= ImGuiDir_Left;
    ImGui::GetStyle().ChildRounding           = 0.0f;
    ImGui::GetStyle().ChildBorderSize         = 0.0f;
    ImGui::GetStyle().PopupRounding           = 0.0f;
    ImGui::GetStyle().PopupBorderSize         = 0.0f;
    ImGui::GetStyle().FramePadding            = ImVec2(1.0,0.0);
    ImGui::GetStyle().FrameRounding           = 0.0f;
    ImGui::GetStyle().FrameBorderSize         = 0.0f;
    ImGui::GetStyle().ItemSpacing             = ImVec2(1,0.0);
    ImGui::GetStyle().ItemInnerSpacing        = ImVec2(1,0);
    ImGui::GetStyle().TouchExtraPadding       = ImVec2(0.5,0.0);
    ImGui::GetStyle().IndentSpacing           = 1.0f;
    ImGui::GetStyle().ColumnsMinSpacing       = 1.0f;
    ImGui::GetStyle().ScrollbarSize           = 0.5f;
    ImGui::GetStyle().ScrollbarRounding       = 0.0f;
    ImGui::GetStyle().GrabMinSize             = 0.1f;
    ImGui::GetStyle().GrabRounding            = 0.0f;
    ImGui::GetStyle().TabRounding             = 0.0f;
    ImGui::GetStyle().TabBorderSize           = 0.0f;
    ImGui::GetStyle().ColorButtonPosition     = ImGuiDir_Right;
    ImGui::GetStyle().ButtonTextAlign         = ImVec2(0.5f,0.0f);
    ImGui::GetStyle().SelectableTextAlign     = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().DisplayWindowPadding    = ImVec2(0,0);
    ImGui::GetStyle().DisplaySafeAreaPadding  = ImVec2(0,0);
    ImGui::GetStyle().CellPadding             = ImVec2(1,0);
    ImGui::GetStyle().MouseCursorScale        = 1.0f;
    ImGui::GetStyle().AntiAliasedLines        = false;
    ImGui::GetStyle().AntiAliasedFill         = false;
    ImGui::GetStyle().CurveTessellationTol    = 1.25f;

    ImGui::GetStyle().Colors[ImGuiCol_WindowBg]         = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBg]          = ImVec4(0.35, 0.35, 0.35, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBgCollapsed] = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TextSelectedBg]   = ImVec4(0.75, 0.75, 0.75, 0.5f);

    ImFontConfig fontConfig;
    fontConfig.GlyphMinAdvanceX = 1.0f;
    fontConfig.SizePixels = 1.00;
    ImGui::GetIO().Fonts->AddFontDefault(&fontConfig);

    // Build atlas
    unsigned char* tex_pixels = NULL;
    int tex_w, tex_h;
    ImGui::GetIO().Fonts->GetTexDataAsRGBA32(&tex_pixels, &tex_w, &tex_h);

    return true;
}